

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O1

void UnityPrintFloat(UNITY_DOUBLE input_number)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  char *string;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  float fVar13;
  char buf [16];
  undefined8 uStack_40;
  byte local_38 [16];
  UNITY_DOUBLE local_28;
  
  if (input_number < 0.0) {
    uStack_40 = 0x103290;
    local_28 = input_number;
    putchar(0x2d);
    input_number = -local_28;
  }
  if ((input_number == 0.0) && (!NAN(input_number))) {
    string = "0";
LAB_001032cf:
    UnityPrint(string);
    return;
  }
  if (NAN(input_number)) {
    string = "nan";
    goto LAB_001032cf;
  }
  if (ABS(input_number) == INFINITY) {
    string = "inf";
    goto LAB_001032cf;
  }
  local_38[0] = 0;
  local_38[1] = 0;
  local_38[2] = 0;
  local_38[3] = 0;
  local_38[4] = 0;
  local_38[5] = 0;
  local_38[6] = 0;
  local_38[7] = 0;
  local_38[8] = 0;
  local_38[9] = 0;
  local_38[10] = 0;
  local_38[0xb] = 0;
  local_38[0xc] = 0;
  local_38[0xd] = 0;
  local_38[0xe] = 0;
  local_38[0xf] = 0;
  fVar13 = 1.0;
  if (1.0 <= input_number) {
    if (input_number <= 1e+07) {
      iVar6 = (int)input_number;
      iVar2 = 0;
      if (iVar6 < 1000000) {
        iVar2 = 0;
        fVar13 = 1.0;
        iVar4 = iVar6;
        do {
          iVar6 = iVar4 * 10;
          fVar13 = fVar13 * 10.0;
          iVar2 = iVar2 + -1;
          bVar12 = iVar4 < 100000;
          iVar4 = iVar6;
        } while (bVar12);
      }
      input_number = (input_number - (float)(int)input_number) * fVar13;
      goto LAB_001033fe;
    }
    iVar6 = 0;
    iVar2 = 0;
    for (; 1e+16 < input_number; input_number = input_number / 1e+10) {
      iVar2 = iVar2 + 10;
    }
    if (input_number <= 1e+07) goto LAB_001033fe;
    fVar13 = 1.0;
    do {
      fVar13 = fVar13 * 10.0;
      iVar2 = iVar2 + 1;
      fVar1 = input_number / fVar13;
    } while (1e+07 < input_number / fVar13);
  }
  else {
    iVar6 = 0;
    iVar2 = 0;
    for (; input_number < 0.001; input_number = input_number * 1e+10) {
      iVar2 = iVar2 + -10;
    }
    if (1e+06 <= input_number) goto LAB_001033fe;
    fVar13 = 1.0;
    do {
      fVar13 = fVar13 * 10.0;
      iVar2 = iVar2 + -1;
      fVar1 = input_number * fVar13;
    } while (input_number * fVar13 < 1e+06);
  }
  input_number = fVar1;
  iVar6 = 0;
LAB_001033fe:
  uVar5 = ((int)(input_number + input_number) - ((int)(input_number + input_number) + 1 >> 0x1f)) +
          1 >> 1;
  if ((((uVar5 & 1) != 0) && ((float)(int)uVar5 - input_number == 0.5)) &&
     (!NAN((float)(int)uVar5 - input_number))) {
    uVar5 = uVar5 - 1;
  }
  iVar6 = uVar5 + iVar6;
  iVar4 = 1000000;
  if (iVar6 < 10000000) {
    iVar4 = iVar6;
  }
  iVar3 = iVar2 + (uint)(9999999 < iVar6);
  uVar5 = 6;
  if (iVar2 + (uint)(9999999 < iVar6) + 10 < 0xb) {
    uVar5 = -iVar3;
  }
  uVar8 = uVar5;
  if (0 < (int)uVar5) {
    do {
      if (iVar4 % 10 != 0) break;
      iVar4 = iVar4 / 10;
      uVar7 = uVar8 - 1;
      bVar12 = 1 < (int)uVar8;
      uVar8 = uVar7;
    } while (bVar12);
  }
  if ((iVar4 != 0) || (uVar11 = 0, -1 < (int)uVar8)) {
    uVar11 = 0;
    do {
      do {
        uVar9 = uVar11;
        iVar6 = iVar4 / 10;
        uVar11 = uVar9 + 1;
        local_38[uVar9] = (char)iVar4 + (char)iVar6 * -10 + 0x30;
        uVar7 = iVar4 - 10;
        iVar4 = iVar6;
      } while (uVar7 < 0xffffffed);
    } while ((long)uVar9 < (long)(int)uVar8);
  }
  uVar5 = uVar5 + iVar3;
  if (0 < (int)uVar11) {
    lVar10 = (uVar11 & 0xffffffff) + 1;
    do {
      if (lVar10 - (ulong)uVar8 == 1) {
        uStack_40 = 0x103543;
        putchar(0x2e);
      }
      uStack_40 = 0x10354e;
      putchar((int)*(char *)((long)&uStack_40 + lVar10 + 6));
      lVar10 = lVar10 + -1;
    } while (1 < lVar10);
  }
  if (uVar5 != 0) {
    uStack_40 = 0x103565;
    putchar(0x65);
    if ((int)uVar5 < 0) {
      uStack_40 = 0x10357f;
      putchar(0x2d);
      uVar5 = -uVar5;
    }
    else {
      uStack_40 = 0x103573;
      putchar(0x2b);
    }
    uVar11 = 0xffffffffffffffff;
    do {
      local_38[uVar11 + 1] = (char)uVar5 + (char)(uVar5 / 10) * -10 | 0x30;
      bVar12 = 9 < uVar5;
      uVar11 = uVar11 + 1;
      uVar5 = uVar5 / 10;
    } while (uVar11 == 0 || bVar12);
    do {
      uStack_40 = 0x1035ca;
      putchar((int)(char)local_38[uVar11 & 0xffffffff]);
      uVar11 = uVar11 - 1;
    } while (1 < (int)uVar11 + 2);
  }
  return;
}

Assistant:

void UnityPrintFloat(const UNITY_DOUBLE input_number)
{
#ifdef UNITY_INCLUDE_DOUBLE
    static const int sig_digits = 9;
    static const UNITY_INT32 min_scaled = 100000000;
    static const UNITY_INT32 max_scaled = 1000000000;
#else
    static const int sig_digits = 7;
    static const UNITY_INT32 min_scaled = 1000000;
    static const UNITY_INT32 max_scaled = 10000000;
#endif

    UNITY_DOUBLE number = input_number;

    /* print minus sign (does not handle negative zero) */
    if (number < 0.0f)
    {
        UNITY_OUTPUT_CHAR('-');
        number = -number;
    }

    /* handle zero, NaN, and +/- infinity */
    if (number == 0.0f)
    {
        UnityPrint("0");
    }
    else if (isnan(number))
    {
        UnityPrint("nan");
    }
    else if (isinf(number))
    {
        UnityPrint("inf");
    }
    else
    {
        UNITY_INT32 n_int = 0, n;
        int exponent = 0;
        int decimals, digits;
        char buf[16] = {0};

        /*
         * Scale up or down by powers of 10.  To minimize rounding error,
         * start with a factor/divisor of 10^10, which is the largest
         * power of 10 that can be represented exactly.  Finally, compute
         * (exactly) the remaining power of 10 and perform one more
         * multiplication or division.
         */
        if (number < 1.0f)
        {
            UNITY_DOUBLE factor = 1.0f;

            while (number < (UNITY_DOUBLE)max_scaled / 1e10f)  { number *= 1e10f; exponent -= 10; }
            while (number * factor < (UNITY_DOUBLE)min_scaled) { factor *= 10.0f; exponent--; }

            number *= factor;
        }
        else if (number > (UNITY_DOUBLE)max_scaled)
        {
            UNITY_DOUBLE divisor = 1.0f;

            while (number > (UNITY_DOUBLE)min_scaled * 1e10f)   { number  /= 1e10f; exponent += 10; }
            while (number / divisor > (UNITY_DOUBLE)max_scaled) { divisor *= 10.0f; exponent++; }

            number /= divisor;
        }
        else
        {
            /*
             * In this range, we can split off the integer part before
             * doing any multiplications.  This reduces rounding error by
             * freeing up significant bits in the fractional part.
             */
            UNITY_DOUBLE factor = 1.0f;
            n_int = (UNITY_INT32)number;
            number -= (UNITY_DOUBLE)n_int;

            while (n_int < min_scaled) { n_int *= 10; factor *= 10.0f; exponent--; }

            number *= factor;
        }

        /* round to nearest integer */
        n = ((UNITY_INT32)(number + number) + 1) / 2;

#ifndef UNITY_ROUND_TIES_AWAY_FROM_ZERO
        /* round to even if exactly between two integers */
        if ((n & 1) && (((UNITY_DOUBLE)n - number) == 0.5f))
            n--;
#endif

        n += n_int;

        if (n >= max_scaled)
        {
            n = min_scaled;
            exponent++;
        }

        /* determine where to place decimal point */
        decimals = ((exponent <= 0) && (exponent >= -(sig_digits + 3))) ? (-exponent) : (sig_digits - 1);
        exponent += decimals;

        /* truncate trailing zeroes after decimal point */
        while ((decimals > 0) && ((n % 10) == 0))
        {
            n /= 10;
            decimals--;
        }

        /* build up buffer in reverse order */
        digits = 0;
        while ((n != 0) || (digits < (decimals + 1)))
        {
            buf[digits++] = (char)('0' + n % 10);
            n /= 10;
        }
        while (digits > 0)
        {
            if (digits == decimals) { UNITY_OUTPUT_CHAR('.'); }
            UNITY_OUTPUT_CHAR(buf[--digits]);
        }

        /* print exponent if needed */
        if (exponent != 0)
        {
            UNITY_OUTPUT_CHAR('e');

            if (exponent < 0)
            {
                UNITY_OUTPUT_CHAR('-');
                exponent = -exponent;
            }
            else
            {
                UNITY_OUTPUT_CHAR('+');
            }

            digits = 0;
            while ((exponent != 0) || (digits < 2))
            {
                buf[digits++] = (char)('0' + exponent % 10);
                exponent /= 10;
            }
            while (digits > 0)
            {
                UNITY_OUTPUT_CHAR(buf[--digits]);
            }
        }
    }
}